

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.cc
# Opt level: O2

int RAND_load_file(char *file,long max_bytes)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x7fffffff;
  if ((max_bytes & 0xffffffff80000000U) == 0) {
    iVar2 = (int)max_bytes;
  }
  iVar1 = 1;
  if (-1 < max_bytes) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int RAND_load_file(const char *path, long num) {
  if (num < 0) {  // read the "whole file"
    return 1;
  } else if (num <= INT_MAX) {
    return (int)num;
  } else {
    return INT_MAX;
  }
}